

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

void __thiscall
nigel::Preprocessor::processFile
          (Preprocessor *this,CodeBase *base,shared_ptr<boost::filesystem::path> *path,
          vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
          *result,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *definitions,size_t *ifdefCount,bool *ignoreifdef,size_t *posAtIgnore)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  _Rb_tree_node_base *p_Var9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  mapped_type *pmVar13;
  size_t sVar14;
  iterator iVar15;
  byte bVar16;
  size_t *psVar17;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar19;
  undefined1 auStack_5a8 [8];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_5a0;
  size_t local_598;
  shared_ptr<boost::filesystem::path> *local_590;
  BuilderExecutable *local_588;
  String def;
  key_type local_560;
  String identifier;
  String str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4e0;
  vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_> *local_4d8;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4b0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  shared_ptr<boost::filesystem::path> local_450;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_400;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  shared_ptr<boost::filesystem::path> local_390;
  shared_ptr<boost::filesystem::path> local_380;
  shared_ptr<boost::filesystem::path> local_370;
  shared_ptr<boost::filesystem::path> local_360;
  shared_ptr<boost::filesystem::path> local_350;
  shared_ptr<boost::filesystem::path> local_340;
  shared_ptr<boost::filesystem::path> local_330;
  shared_ptr<boost::filesystem::path> local_320;
  shared_ptr<boost::filesystem::path> local_310;
  shared_ptr<boost::filesystem::path> local_300;
  shared_ptr<boost::filesystem::path> local_2f0;
  shared_ptr<boost::filesystem::path> local_2e0;
  shared_ptr<boost::filesystem::path> local_2d0;
  shared_ptr<boost::filesystem::path> local_2c0;
  shared_ptr<boost::filesystem::path> local_2b0;
  shared_ptr<boost::filesystem::path> local_2a0;
  shared_ptr<boost::filesystem::path> local_290;
  shared_ptr<boost::filesystem::path> local_280;
  shared_ptr<boost::filesystem::path> local_270;
  CodeBase *local_260;
  long *local_258 [2];
  long local_248 [2];
  ifstream filestream;
  byte abStack_218 [488];
  
  local_590 = path;
  local_588 = &this->super_BuilderExecutable;
  local_4d8 = result;
  local_260 = base;
  std::ifstream::ifstream
            (&filestream,
             (string *)
             (path->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             _S_bin);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  lVar10 = *(long *)(_filestream + -0x18);
  if ((abStack_218[lVar10] & 5) == 0) {
    paVar2 = &identifier.field_2;
    p_Var1 = &(definitions->_M_t)._M_impl.super__Rb_tree_header;
    local_598 = 0;
    while( true ) {
      cVar5 = std::ios::widen((char)auStack_5a8 + (char)lVar10 + 'p');
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&filestream,(string *)&str,cVar5);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
      local_598 = local_598 + 1;
LAB_0016f632:
      if (str._M_string_length == 0) goto LAB_0016ff01;
      if (((ulong)(byte)*str._M_dataplus._M_p < 0x21) &&
         ((0x100002600U >> ((ulong)(byte)*str._M_dataplus._M_p & 0x3f) & 1) != 0)) {
        std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
        std::__cxx11::string::operator=((string *)&str,(string *)&identifier);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)identifier._M_dataplus._M_p != paVar2) {
          operator_delete(identifier._M_dataplus._M_p,identifier.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0016f632;
      }
      if (str._M_string_length == 0) goto LAB_0016ff01;
      cVar5 = (char)&str;
      if (*str._M_dataplus._M_p == '#') {
        if (str._M_string_length == 1) {
          local_4d0.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                    (&local_4d0.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                     &local_4d0,
                     (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&identifier,&str);
          local_390.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (local_590->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
          local_390.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_590->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if (local_390.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_390.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_390.
                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_390.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_390.
                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          BuilderExecutable::generateNotification
                    (local_588,warn_emptyDirective,&local_4d0,local_598,&local_390);
          _Var18._M_pi = local_4d0.
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
          if (local_390.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_390.
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var18._M_pi = local_4d0.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
        }
        else if (*ignoreifdef == true) {
          lVar10 = std::__cxx11::string::find((char *)&str,0x177b17,0);
          if ((lVar10 == 1) ||
             (lVar10 = std::__cxx11::string::find((char *)&str,0x177b1d,0), lVar10 == 1)) {
            *ifdefCount = *ifdefCount + 1;
          }
          lVar10 = std::__cxx11::string::find((char *)&str,0x177b24,0);
          if (lVar10 == 1) {
            if (*ifdefCount != 0) {
              if (*posAtIgnore == *ifdefCount) {
                *ignoreifdef = false;
              }
              goto LAB_0016ff01;
            }
            local_3a0.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                      (&local_3a0.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       &local_3a0,
                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&identifier,&str);
            local_270.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (local_590->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_270.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (local_590->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
            if (local_270.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_270.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_270.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_270.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_270.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            BuilderExecutable::generateNotification
                      (local_588,err_elseifWithoutIfdef,&local_3a0,local_598,&local_270);
            _Var18._M_pi = local_3a0.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            if (local_270.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_270.
                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var18._M_pi = local_3a0.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
            }
          }
          else {
            lVar10 = std::__cxx11::string::find((char *)&str,0x177b2b,0);
            if (lVar10 != 1) goto LAB_0016ff01;
            sVar14 = *ifdefCount;
            if (sVar14 != 0) {
LAB_0016fb56:
              if (*posAtIgnore == sVar14) {
                *ignoreifdef = false;
              }
              sVar14 = sVar14 - 1;
              psVar17 = ifdefCount;
LAB_0016fb79:
              *psVar17 = sVar14;
              goto LAB_0016ff01;
            }
            local_3b0.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                      (&local_3b0.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       &local_3b0,
                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&identifier,&str);
            local_280.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (local_590->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_280.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (local_590->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
            if (local_280.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_280.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_280.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_280.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_280.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            BuilderExecutable::generateNotification
                      (local_588,err_endifWithoutIfdef,&local_3b0,local_598,&local_280);
            _Var18._M_pi = local_3b0.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            if (local_280.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_280.
                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var18._M_pi = local_3b0.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
            }
          }
        }
        else {
          lVar10 = std::__cxx11::string::find((char *)&str,0x177b31,0);
          if (lVar10 == 1) {
            if (str._M_string_length < 9) {
              local_3c0.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                        (&local_3c0.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         &local_3c0,
                         (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&identifier,&str);
              local_290.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (local_590->
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_290.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_590->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_290.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_290.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_290.
                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_290.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_290.
                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              BuilderExecutable::generateNotification
                        (local_588,err_incompleteDefineDirective,&local_3c0,local_598,&local_290);
              _Var18._M_pi = local_3c0.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
              if (local_290.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_290.
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                _Var18._M_pi = local_3c0.
                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
              }
              goto joined_r0x00170b44;
            }
            local_5a0 = &definitions->_M_t;
            uVar11 = std::__cxx11::string::find(cVar5,10);
            uVar12 = std::__cxx11::string::find(cVar5,0xd);
            if (uVar12 < uVar11) {
              uVar11 = std::__cxx11::string::find(cVar5,0xd);
            }
            uVar12 = std::__cxx11::string::find(cVar5,0x20);
            if (uVar12 < uVar11) {
              std::__cxx11::string::find(cVar5,0x20);
            }
            std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
            def._M_dataplus._M_p = (pointer)&def.field_2;
            def._M_string_length = 0;
            def.field_2._M_local_buf[0] = '\0';
            if (identifier._M_string_length + 9 < str._M_string_length) {
              uVar11 = std::__cxx11::string::find(cVar5,10);
              uVar12 = std::__cxx11::string::find(cVar5,0xd);
              if (uVar12 < uVar11) {
                std::__cxx11::string::find(cVar5,0xd);
              }
              std::__cxx11::string::substr((ulong)&local_560,(ulong)&str);
              std::__cxx11::string::operator=((string *)&def,(string *)&local_560);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_560._M_dataplus._M_p != &local_560.field_2) {
                operator_delete(local_560._M_dataplus._M_p,
                                local_560.field_2._M_allocated_capacity + 1);
              }
            }
            definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_5a0;
            pmVar13 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_5a0,(key_type *)&identifier);
            std::__cxx11::string::_M_assign((string *)pmVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)def._M_dataplus._M_p != &def.field_2) {
              operator_delete(def._M_dataplus._M_p,
                              CONCAT71(def.field_2._M_allocated_capacity._1_7_,
                                       def.field_2._M_local_buf[0]) + 1);
            }
joined_r0x001701ec:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)identifier._M_dataplus._M_p != paVar2) {
              operator_delete(identifier._M_dataplus._M_p,
                              identifier.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0016ff01;
          }
          lVar10 = std::__cxx11::string::find((char *)&str,0x177b38,0);
          if (lVar10 == 1) {
            if (7 < str._M_string_length) {
              local_5a0 = &definitions->_M_t;
              uVar11 = std::__cxx11::string::find(cVar5,10);
              uVar12 = std::__cxx11::string::find(cVar5,0xd);
              if (uVar12 < uVar11) {
                std::__cxx11::string::find(cVar5,0xd);
              }
              std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
              iVar15 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::find(local_5a0,(key_type *)&identifier);
              definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_5a0;
              if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
                local_3d0.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                          (&local_3d0.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           &local_3d0,
                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&def,&str);
                definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_5a0;
                local_2a0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (local_590->
                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                local_2a0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (local_590->
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_2a0.
                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_2a0.
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_2a0.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_2a0.
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_2a0.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                BuilderExecutable::generateNotification
                          (local_588,warn_undefinedIdentifiernAtUndefDirective,&local_3d0,local_598,
                           &local_2a0);
                _Var18._M_pi = local_3d0.
                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                if (local_2a0.
                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_2a0.
                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                  _Var18._M_pi = local_3d0.
                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                }
                goto joined_r0x00170d86;
              }
              pVar19 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::equal_range(local_5a0,(key_type *)&identifier);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::_M_erase_aux(&definitions->_M_t,(_Base_ptr)pVar19.first._M_node,
                             (_Base_ptr)pVar19.second._M_node);
              goto joined_r0x001701ec;
            }
            local_3e0.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                      (&local_3e0.
                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       &local_3e0,
                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&identifier,&str);
            local_2b0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (local_590->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_2b0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (local_590->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
            if (local_2b0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_2b0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2b0.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_2b0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2b0.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            BuilderExecutable::generateNotification
                      (local_588,err_incompleteUndefineDirective,&local_3e0,local_598,&local_2b0);
            _Var18._M_pi = local_3e0.
                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
            if (local_2b0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_2b0.
                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              _Var18._M_pi = local_3e0.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
            }
          }
          else {
            lVar10 = std::__cxx11::string::find((char *)&str,0x177b17,0);
            if (lVar10 == 1) {
              if (7 < str._M_string_length) {
                local_5a0 = &definitions->_M_t;
                uVar11 = std::__cxx11::string::find(cVar5,10);
                uVar12 = std::__cxx11::string::find(cVar5,0xd);
                if (uVar12 < uVar11) {
                  std::__cxx11::string::find(cVar5,0xd);
                }
                std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                *ifdefCount = *ifdefCount + 1;
                iVar15 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::find(local_5a0,(key_type *)&identifier);
                definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_5a0;
                if ((_Rb_tree_header *)iVar15._M_node == p_Var1) {
LAB_001701c6:
                  *ignoreifdef = true;
                  *posAtIgnore = *ifdefCount;
                  definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_5a0;
                }
                goto joined_r0x001701ec;
              }
              local_3f0.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                        (&local_3f0.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                         &local_3f0,
                         (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&identifier,&str);
              local_2c0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (local_590->
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              local_2c0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_590->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_2c0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2c0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_2c0.
                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2c0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_use_count =
                       (local_2c0.
                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              BuilderExecutable::generateNotification
                        (local_588,err_elseifWithoutIfdef,&local_3f0,local_598,&local_2c0);
              _Var18._M_pi = local_3f0.
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
              if (local_2c0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2c0.
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                _Var18._M_pi = local_3f0.
                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
              }
            }
            else {
              lVar10 = std::__cxx11::string::find((char *)&str,0x177b1d,0);
              if (lVar10 == 1) {
                if (8 < str._M_string_length) {
                  local_5a0 = &definitions->_M_t;
                  uVar11 = std::__cxx11::string::find(cVar5,10);
                  uVar12 = std::__cxx11::string::find(cVar5,0xd);
                  if (uVar12 < uVar11) {
                    std::__cxx11::string::find(cVar5,0xd);
                  }
                  std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                  *ifdefCount = *ifdefCount + 1;
                  iVar15 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::find(local_5a0,(key_type *)&identifier);
                  definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_5a0;
                  if ((_Rb_tree_header *)iVar15._M_node != p_Var1) goto LAB_001701c6;
                  goto joined_r0x001701ec;
                }
                local_400.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                          (&local_400.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           &local_400,
                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&identifier,&str);
                local_2d0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (local_590->
                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                local_2d0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (local_590->
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
                if (local_2d0.
                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (local_2d0.
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_2d0.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (local_2d0.
                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_M_use_count =
                         (local_2d0.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
                  }
                }
                BuilderExecutable::generateNotification
                          (local_588,err_elseifWithoutIfdef,&local_400,local_598,&local_2d0);
                _Var18._M_pi = local_400.
                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi;
                if (local_2d0.
                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_2d0.
                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                  _Var18._M_pi = local_400.
                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                }
              }
              else {
                lVar10 = std::__cxx11::string::find((char *)&str,0x177b24,0);
                if (lVar10 == 1) {
                  sVar14 = *ifdefCount;
                  if (sVar14 != 0) {
                    if (*ignoreifdef == false) {
                      *ignoreifdef = true;
                      psVar17 = posAtIgnore;
                      goto LAB_0016fb79;
                    }
                    *ignoreifdef = false;
                    goto LAB_0016ff01;
                  }
                  local_410.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                            (&local_410.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             &local_410,
                             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&identifier,&str);
                  local_2e0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (local_590->
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  local_2e0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (local_590->
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_2e0.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_2e0.
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_2e0.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_2e0.
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_2e0.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  BuilderExecutable::generateNotification
                            (local_588,err_elseifWithoutIfdef,&local_410,local_598,&local_2e0);
                  _Var18._M_pi = local_410.
                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                  if (local_2e0.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_2e0.
                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                    _Var18._M_pi = local_410.
                                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                  }
                }
                else {
                  lVar10 = std::__cxx11::string::find((char *)&str,0x177b2b,0);
                  if (lVar10 != 1) {
                    lVar10 = std::__cxx11::string::find((char *)&str,0x1754b8,0);
                    if (lVar10 == 1) {
                      local_5a0 = &definitions->_M_t;
                      uVar11 = std::__cxx11::string::find(cVar5,10);
                      uVar12 = std::__cxx11::string::find(cVar5,0xd);
                      if (uVar12 < uVar11) {
                        std::__cxx11::string::find(cVar5,0xd);
                      }
                      std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                      local_430.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                (&local_430.
                                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  **)&local_430,
                                 (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&def,&str);
                      definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_5a0;
                      local_300.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (local_590->
                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr;
                      local_300.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (local_590->
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                      if (local_300.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (local_300.
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_300.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (local_300.
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_300.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      BuilderExecutable::generateNotification
                                (local_588,err_errorDirective,&local_430,local_598,&local_300);
                      _Var18._M_pi = local_430.
                                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                      if (local_300.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_300.
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
                        _Var18._M_pi = local_430.
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                      }
                    }
                    else {
                      local_5a0 = &definitions->_M_t;
                      lVar10 = std::__cxx11::string::find((char *)&str,0x17555e,0);
                      if (lVar10 != 1) {
                        lVar10 = std::__cxx11::string::find((char *)&str,0x177b3e,0);
                        if (lVar10 == 1) {
                          if (10 < str._M_string_length) {
                            std::__cxx11::string::find(cVar5,0x22);
                            std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                            std::__cxx11::string::find
                                      ((char)(allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&identifier,0x22);
                            std::__cxx11::string::substr((ulong)&local_560,(ulong)&identifier);
                            def._M_dataplus._M_p = (pointer)&def.field_2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&def,local_560._M_dataplus._M_p,
                                       local_560._M_dataplus._M_p + local_560._M_string_length);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_560._M_dataplus._M_p != &local_560.field_2) {
                              operator_delete(local_560._M_dataplus._M_p,
                                              local_560.field_2._M_allocated_capacity + 1);
                            }
                            bVar6 = boost::filesystem::path::has_parent_path
                                              ((local_590->
                                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr);
                            if (bVar6) {
                              boost::filesystem::path::parent_path();
                              boost::filesystem::detail::absolute
                                        ((path *)&local_560,(path *)&def,(error_code *)local_258);
                              std::__cxx11::string::operator=((string *)&def,(string *)&local_560);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_560._M_dataplus._M_p != &local_560.field_2) {
                                operator_delete(local_560._M_dataplus._M_p,
                                                local_560.field_2._M_allocated_capacity + 1);
                              }
                              if (local_258[0] != local_248) {
                                operator_delete(local_258[0],local_248[0] + 1);
                              }
                            }
                            local_450.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (element_type *)0x0;
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                            __shared_count<boost::filesystem::path,std::allocator<boost::filesystem::path>,boost::filesystem::path&>
                                      (&local_450.
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,(path **)&local_450,
                                       (allocator<boost::filesystem::path> *)&local_560,(path *)&def
                                      );
                            processFile((Preprocessor *)local_588,local_260,&local_450,local_4d8,
                                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_5a0,ifdefCount,ignoreifdef,posAtIgnore);
                            if (local_450.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_450.
                                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)def._M_dataplus._M_p != &def.field_2) {
                              operator_delete(def._M_dataplus._M_p,
                                              CONCAT71(def.field_2._M_allocated_capacity._1_7_,
                                                       def.field_2._M_local_buf[0]) + 1);
                            }
                            definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_5a0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)identifier._M_dataplus._M_p != paVar2) {
                              operator_delete(identifier._M_dataplus._M_p,
                                              identifier.field_2._M_allocated_capacity + 1);
                              definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_5a0;
                            }
                            goto LAB_0016ff01;
                          }
                          local_460.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr = (element_type *)0x0;
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                          __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                    (&local_460.
                                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      **)&local_460,
                                     (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&identifier,&str);
                          local_320.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr = (local_590->
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                          local_320.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi =
                               (local_590->
                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                               )._M_refcount._M_pi;
                          if (local_320.
                              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              (local_320.
                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_M_use_count =
                                   (local_320.
                                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              (local_320.
                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_M_use_count =
                                   (local_320.
                                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_M_use_count + 1;
                            }
                          }
                          BuilderExecutable::generateNotification
                                    (local_588,err_incompleteIncludeDirective,&local_460,local_598,
                                     &local_320);
                          definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_5a0;
                          _Var18._M_pi = local_460.
                                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi;
                          if (local_320.
                              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi !=
                              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      (local_320.
                                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
                            definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_5a0;
                            _Var18._M_pi = local_460.
                                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                          }
                        }
                        else {
                          lVar10 = std::__cxx11::string::find((char *)&str,0x177b46,0);
                          if (lVar10 == 1) {
                            if (str._M_string_length < 9) {
                              local_4a0.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (element_type *)0x0;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                        (&local_4a0.
                                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          **)&local_4a0,
                                         (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&identifier,&str);
                              local_360.
                              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (local_590->
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr;
                              local_360.
                              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi =
                                   (local_590->
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                              if (local_360.
                                  super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_360.
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_360.
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_360.
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_360.
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              BuilderExecutable::generateNotification
                                        (local_588,err_incompletePragma,&local_4a0,local_598,
                                         &local_360);
                              definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_5a0;
                              _Var18._M_pi = local_4a0.
                                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi;
                              if (local_360.
                                  super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_360.
                                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                                definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)local_5a0;
                                _Var18._M_pi = local_4a0.
                                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi;
                              }
                              goto joined_r0x00170b44;
                            }
                            uVar11 = std::__cxx11::string::find(cVar5,10);
                            uVar12 = std::__cxx11::string::find(cVar5,0xd);
                            if (uVar12 < uVar11) {
                              uVar11 = std::__cxx11::string::find(cVar5,0xd);
                            }
                            uVar12 = std::__cxx11::string::find(cVar5,0x20);
                            bVar16 = 0x20;
                            if (uVar12 < uVar11) {
LAB_00170be8:
                              std::__cxx11::string::find(cVar5,(ulong)bVar16);
                            }
                            else {
                              uVar12 = std::__cxx11::string::find(cVar5,0x3d);
                              bVar16 = 0x3d;
                              if (uVar12 < uVar11) goto LAB_00170be8;
                            }
                            std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                            def._M_dataplus._M_p = (pointer)&def.field_2;
                            def._M_string_length = 0;
                            def.field_2._M_local_buf[0] = '\0';
                            if (identifier._M_string_length + 9 < str._M_string_length) {
                              uVar11 = std::__cxx11::string::find(cVar5,10);
                              uVar12 = std::__cxx11::string::find(cVar5,0xd);
                              if (uVar12 < uVar11) {
                                std::__cxx11::string::find(cVar5,0xd);
                              }
                              std::__cxx11::string::substr((ulong)&local_560,(ulong)&str);
                              std::__cxx11::string::operator=((string *)&def,(string *)&local_560);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_560._M_dataplus._M_p != &local_560.field_2) {
                                operator_delete(local_560._M_dataplus._M_p,
                                                local_560.field_2._M_allocated_capacity + 1);
                              }
                            }
                            iVar7 = std::__cxx11::string::compare((char *)&identifier);
                            if (iVar7 == 0) {
                              if (def._M_string_length == 0) {
                                local_470.
                                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (element_type *)0x0;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                          (&local_470.
                                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            **)&local_470,
                                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_560,&str);
                                local_330.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (local_590->
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr;
                                local_330.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi =
                                     (local_590->
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount._M_pi;
                                if (local_330.
                                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_330.
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_330.
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_330.
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_330.
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                BuilderExecutable::generateNotification
                                          (local_588,err_incompleteMemModelPragma,&local_470,
                                           local_598,&local_330);
                                _Var18._M_pi = local_470.
                                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi;
                                if (local_330.
                                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_330.
                                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                  _Var18._M_pi = local_470.
                                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_refcount._M_pi;
                                }
                                goto joined_r0x001714cc;
                              }
                              iVar7 = std::__cxx11::string::compare((char *)&def);
                              if (iVar7 != 0) {
                                iVar7 = std::__cxx11::string::compare((char *)&def);
                                if (iVar7 == 0) {
                                  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_560,"byte","");
                                  pmVar13 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_5a0,&local_560);
                                  std::__cxx11::string::operator=((string *)pmVar13,"norm byte");
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_560._M_dataplus._M_p != &local_560.field_2) {
                                    operator_delete(local_560._M_dataplus._M_p,
                                                    local_560.field_2._M_allocated_capacity + 1);
                                  }
                                  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_560,"int","");
                                  pmVar13 = std::
                                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                            ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_5a0,&local_560);
                                  std::__cxx11::string::operator=((string *)pmVar13,"norm int");
                                  goto LAB_00171462;
                                }
                                local_480.
                                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (element_type *)0x0;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                          (&local_480.
                                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            **)&local_480,
                                           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_560,&str);
                                local_340.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr = (local_590->
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr;
                                local_340.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi =
                                     (local_590->
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount._M_pi;
                                if (local_340.
                                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    (local_340.
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_340.
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    (local_340.
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_M_use_count =
                                         (local_340.
                                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_M_use_count + 1;
                                  }
                                }
                                BuilderExecutable::generateNotification
                                          (local_588,err_unknownMemModelPragma,&local_480,local_598,
                                           &local_340);
                                if (local_340.
                                    super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi !=
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_340.
                                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
                                }
                                _Var18._M_pi = local_480.
                                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi;
                                if (local_480.
                                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi ==
                                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                goto LAB_00171226;
                                goto LAB_00171221;
                              }
                              local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_560,"byte","");
                              pmVar13 = std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_5a0,&local_560);
                              std::__cxx11::string::operator=((string *)pmVar13,"fast byte");
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_560._M_dataplus._M_p != &local_560.field_2) {
                                operator_delete(local_560._M_dataplus._M_p,
                                                local_560.field_2._M_allocated_capacity + 1);
                              }
                              local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_560,"int","");
                              pmVar13 = std::
                                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)local_5a0,&local_560);
                              std::__cxx11::string::operator=((string *)pmVar13,"fast int");
LAB_00171462:
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_560._M_dataplus._M_p != &local_560.field_2) {
                                operator_delete(local_560._M_dataplus._M_p,
                                                local_560.field_2._M_allocated_capacity + 1);
                              }
                            }
                            else {
                              local_490.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (element_type *)0x0;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                        (&local_490.
                                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          **)&local_490,
                                         (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_560,&str);
                              local_350.
                              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr = (local_590->
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr;
                              local_350.
                              super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi =
                                   (local_590->
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                              if (local_350.
                                  super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  (local_350.
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_350.
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  (local_350.
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi)->_M_use_count =
                                       (local_350.
                                        super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_M_use_count + 1;
                                }
                              }
                              BuilderExecutable::generateNotification
                                        (local_588,err_unknownPragma,&local_490,local_598,&local_350
                                        );
                              _Var18._M_pi = local_490.
                                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi;
                              if (local_350.
                                  super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_350.
                                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi);
                                _Var18._M_pi = local_490.
                                               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi;
                              }
joined_r0x001714cc:
                              if (_Var18._M_pi !=
                                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00171221:
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (_Var18._M_pi);
                              }
                            }
LAB_00171226:
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)def._M_dataplus._M_p != &def.field_2) {
                              operator_delete(def._M_dataplus._M_p,
                                              CONCAT71(def.field_2._M_allocated_capacity._1_7_,
                                                       def.field_2._M_local_buf[0]) + 1);
                            }
                            definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_5a0;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)identifier._M_dataplus._M_p != paVar2) {
                              operator_delete(identifier._M_dataplus._M_p,
                                              identifier.field_2._M_allocated_capacity + 1);
                              definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_5a0;
                            }
                            goto LAB_0016ff01;
                          }
                          iVar7 = std::__cxx11::string::compare((char *)&str);
                          if (((iVar7 == 0) ||
                              (iVar7 = std::__cxx11::string::compare((char *)&str), iVar7 == 0)) ||
                             (iVar7 = std::__cxx11::string::compare((char *)&str), iVar7 == 0)) {
                            local_4b0.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr = (element_type *)0x0;
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                            __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                      (&local_4b0.
                                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        **)&local_4b0,
                                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&identifier,&str);
                            local_370.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (local_590->
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr;
                            local_370.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi =
                                 (local_590->
                                 super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_refcount._M_pi;
                            if (local_370.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (local_370.
                                 super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_M_use_count =
                                     (local_370.
                                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (local_370.
                                 super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_M_use_count =
                                     (local_370.
                                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            BuilderExecutable::generateNotification
                                      (local_588,warn_emptyDirective,&local_4b0,local_598,&local_370
                                      );
                            definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_5a0;
                            _Var18._M_pi = local_4b0.
                                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                            if (local_370.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_370.
                                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                              definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_5a0;
                              _Var18._M_pi = local_4b0.
                                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi;
                            }
                          }
                          else {
                            local_4c0.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr = (element_type *)0x0;
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                            __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                      (&local_4c0.
                                        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        **)&local_4c0,
                                       (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&identifier,&str);
                            local_380.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr = (local_590->
                                     super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr;
                            local_380.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi =
                                 (local_590->
                                 super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_refcount._M_pi;
                            if (local_380.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                (local_380.
                                 super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_M_use_count =
                                     (local_380.
                                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                (local_380.
                                 super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_M_use_count =
                                     (local_380.
                                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi)->_M_use_count + 1;
                              }
                            }
                            BuilderExecutable::generateNotification
                                      (local_588,err_unknownDirective,&local_4c0,local_598,
                                       &local_380);
                            definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)local_5a0;
                            _Var18._M_pi = local_4c0.
                                           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi;
                            if (local_380.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi !=
                                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                        (local_380.
                                         super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
                              definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)local_5a0;
                              _Var18._M_pi = local_4c0.
                                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi;
                            }
                          }
                        }
                        goto joined_r0x00170b44;
                      }
                      uVar11 = std::__cxx11::string::find(cVar5,10);
                      uVar12 = std::__cxx11::string::find(cVar5,0xd);
                      if (uVar12 < uVar11) {
                        std::__cxx11::string::find(cVar5,0xd);
                      }
                      std::__cxx11::string::substr((ulong)&identifier,(ulong)&str);
                      local_440.
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr = (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                                (&local_440.
                                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  **)&local_440,
                                 (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&def,&str);
                      definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_5a0;
                      local_310.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (local_590->
                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr;
                      local_310.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (local_590->
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                      if (local_310.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          (local_310.
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_310.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          (local_310.
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count =
                               (local_310.
                                super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi)->_M_use_count + 1;
                        }
                      }
                      BuilderExecutable::generateNotification
                                (local_588,warn_warningDirective,&local_440,local_598,&local_310);
                      _Var18._M_pi = local_440.
                                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                      if (local_310.
                          super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                      {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  (local_310.
                                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi);
                        _Var18._M_pi = local_440.
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi;
                      }
                    }
joined_r0x00170d86:
                    if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
                    }
                    goto joined_r0x001701ec;
                  }
                  sVar14 = *ifdefCount;
                  if (sVar14 != 0) goto LAB_0016fb56;
                  local_420.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                            (&local_420.
                              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                             &local_420,
                             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&identifier,&str);
                  local_2f0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (local_590->
                           super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  local_2f0.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (local_590->
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_2f0.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_2f0.
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_2f0.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_2f0.
                       super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_2f0.
                            super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  BuilderExecutable::generateNotification
                            (local_588,err_endifWithoutIfdef,&local_420,local_598,&local_2f0);
                  _Var18._M_pi = local_420.
                                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi;
                  if (local_2f0.
                      super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_2f0.
                               super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                    _Var18._M_pi = local_420.
                                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi;
                  }
                }
              }
            }
          }
        }
joined_r0x00170b44:
        if (_Var18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var18._M_pi);
        }
        goto LAB_0016ff01;
      }
      if (*ignoreifdef != false) goto LAB_0016ff01;
      local_5a0 = &definitions->_M_t;
      identifier._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&identifier,"\r","");
      def._M_string_length = 0;
      def.field_2._M_local_buf[0] = '\0';
      def._M_dataplus._M_p = (pointer)&def.field_2;
      helper::replace<std::__cxx11::string>
                (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &identifier,&def);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)def._M_dataplus._M_p != &def.field_2) {
        operator_delete(def._M_dataplus._M_p,
                        CONCAT71(def.field_2._M_allocated_capacity._1_7_,def.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)identifier._M_dataplus._M_p != paVar2) {
        operator_delete(identifier._M_dataplus._M_p,identifier.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::push_back(cVar5);
      for (p_Var9 = (((_Rep_type *)&local_5a0->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                    _M_left; (_Rb_tree_header *)p_Var9 != p_Var1;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        helper::replace<std::__cxx11::string>
                  (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var9 + 1),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 2)
                  );
      }
      identifier._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&identifier,"__FILE__","");
      helper::replace<std::__cxx11::string>
                (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &identifier,
                 &((local_590->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_pathname);
      paVar3 = &def.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)identifier._M_dataplus._M_p != paVar2) {
        operator_delete(identifier._M_dataplus._M_p,identifier.field_2._M_allocated_capacity + 1);
      }
      identifier._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&identifier,"__LINE__","");
      cVar5 = '\x01';
      if (9 < local_598) {
        sVar14 = local_598;
        cVar4 = '\x04';
        do {
          cVar5 = cVar4;
          if (sVar14 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_0016fca3;
          }
          if (sVar14 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_0016fca3;
          }
          if (sVar14 < 10000) goto LAB_0016fca3;
          bVar6 = 99999 < sVar14;
          sVar14 = sVar14 / 10000;
          cVar4 = cVar5 + '\x04';
        } while (bVar6);
        cVar5 = cVar5 + '\x01';
      }
LAB_0016fca3:
      def._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct((ulong)&def,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (def._M_dataplus._M_p,(uint)def._M_string_length,local_598);
      helper::replace<std::__cxx11::string>
                (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &identifier,&def);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)def._M_dataplus._M_p != paVar3) {
        operator_delete(def._M_dataplus._M_p,
                        CONCAT71(def.field_2._M_allocated_capacity._1_7_,def.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)identifier._M_dataplus._M_p != paVar2) {
        operator_delete(identifier._M_dataplus._M_p,identifier.field_2._M_allocated_capacity + 1);
      }
      identifier._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&identifier,"__TIME__","");
      def._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&def,"");
      helper::replace<std::__cxx11::string>
                (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &identifier,&def);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)def._M_dataplus._M_p != paVar3) {
        operator_delete(def._M_dataplus._M_p,
                        CONCAT71(def.field_2._M_allocated_capacity._1_7_,def.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)identifier._M_dataplus._M_p != paVar2) {
        operator_delete(identifier._M_dataplus._M_p,identifier.field_2._M_allocated_capacity + 1);
      }
      identifier._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&identifier,"__DATE__","");
      def._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&def,"");
      helper::replace<std::__cxx11::string>
                (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &identifier,&def);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)def._M_dataplus._M_p != paVar3) {
        operator_delete(def._M_dataplus._M_p,
                        CONCAT71(def.field_2._M_allocated_capacity._1_7_,def.field_2._M_local_buf[0]
                                ) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)identifier._M_dataplus._M_p != paVar2) {
        operator_delete(identifier._M_dataplus._M_p,identifier.field_2._M_allocated_capacity + 1);
      }
      local_4e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string&>
                (&local_4e0,&local_4e8,
                 (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&def,&str);
      identifier.field_2._M_allocated_capacity =
           (size_type)
           (local_590->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      this_00 = (local_590->super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)
                ._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      identifier._M_dataplus._M_p = (pointer)local_4e8;
      identifier._M_string_length = (size_type)local_4e0._M_pi;
      if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_4e0._M_pi)->_M_use_count = (local_4e0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_4e0._M_pi)->_M_use_count = (local_4e0._M_pi)->_M_use_count + 1;
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      identifier.field_2._8_8_ = this_00;
      std::vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
      emplace_back<nigel::CodeBase::LineContent>(local_4d8,(LineContent *)&identifier);
      if (identifier.field_2._8_8_ != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)identifier.field_2._8_8_);
      }
      if (identifier._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)identifier._M_string_length);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_5a0;
      if (local_4e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4e0._M_pi);
        definitions = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_5a0;
      }
LAB_0016ff01:
      lVar10 = *(long *)(_filestream + -0x18);
      if ((abStack_218[lVar10] & 5) != 0) break;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,
                    CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0]) +
                    1);
  }
  std::ifstream::~ifstream(&filestream);
  return;
}

Assistant:

void Preprocessor::processFile( CodeBase &base, std::shared_ptr<fs::path> path, std::vector<CodeBase::LineContent> &result, std::map<String, String> &definitions, size_t &ifdefCount, bool &ignoreifdef, size_t &posAtIgnore )
	{
		std::ifstream filestream( path->string(), std::ios_base::binary );
		String str;
		size_t lineCount = 0;


		while( filestream && std::getline( filestream, str ) )
		{
			lineCount++;

			//Remove whitespaces
			while( str.size() > 0 && ( str[0] == ' ' || str[0] == '\t' || str[0] == '\r' || str[0] == '\n' ) ) str = str.substr( 1 );

			if( str.size() > 0 )
			{
				if( str[0] == '#' )
				{//Is pp directive
					if( str.size() > 1 )
					{
						if( ignoreifdef )
						{//Is ignoring

							if( str.find( "ifdef" ) == 1 || str.find( "ifndef" ) == 1 )
							{//ifdef/ifndef-directive
								ifdefCount++;
							}
							if( str.find( "elseif" ) == 1 )
							{//elseif-directive
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "endif" ) == 1 )
							{//endif
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
									ifdefCount--;
								}
								else generateNotification( NT::err_endifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
						}
						else
						{
							if( str.find( "define" ) == 1 )
							{//define-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									if( str.find( ' ', 8 ) < pos ) pos = str.find( ' ', 8 );
									String identifier = str.substr( 8, pos - 8 );

									String def;
									if( str.size() > 9 + identifier.size() )
									{
										size_t pos = str.find( '\n' );
										if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
										def = str.substr( 9 + identifier.size(), pos - 9 - identifier.size() );
									}
									definitions[identifier] = def;
								}
								else generateNotification( NT::err_incompleteDefineDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "undef" ) == 1 )
							{//undef-directive
								if( str.size() > 7 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 7, pos - 7 );
									if( definitions.find( identifier ) != definitions.end() ) definitions.erase( identifier );
									else generateNotification( NT::warn_undefinedIdentifiernAtUndefDirective, std::make_shared<String>( str ), lineCount, path );
								}
								else generateNotification( NT::err_incompleteUndefineDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "ifdef" ) == 1 )
							{//ifdef-directive
								if( str.size() > 7 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 7, pos - 7 );

									ifdefCount++;
									if( definitions.find( identifier ) == definitions.end() )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "ifndef" ) == 1 )
							{//ifndef-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 8, pos - 8 );

									ifdefCount++;
									if( definitions.find( identifier ) != definitions.end() )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "elseif" ) == 1 )
							{//elseif-directive
								if( ifdefCount > 0 )
								{
									if( !ignoreifdef )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
									else ignoreifdef = false;
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "endif" ) == 1 )
							{//endif
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
									ifdefCount--;
								}
								else generateNotification( NT::err_endifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "error" ) == 1 )
							{//error
								size_t pos = str.find( '\n' );
								if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
								String errorInfo = str.substr( 8, pos - 8 );

								generateNotification( NT::err_errorDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "warning" ) == 1 )
							{//warning
								size_t pos = str.find( '\n' );
								if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
								String errorInfo = str.substr( 8, pos - 8 );

								generateNotification( NT::warn_warningDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "include" ) == 1 )
							{//include-directive
								if( str.size() > 10 )
								{
									String filename = str.substr( str.find( '\"', 9 ) + 1 );
									fs::path subPath = fs::path( filename.substr( 0, filename.find( '\"' ) ) );
									if( path->has_parent_path() ) subPath = fs::absolute( subPath, path->parent_path() );
									processFile( base, std::make_shared<fs::path>( subPath ), result, definitions, ifdefCount, ignoreifdef, posAtIgnore );
								}
								else generateNotification( NT::err_incompleteIncludeDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "pragma" ) == 1 )
							{//pragma-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									if( str.find( ' ', 8 ) < pos ) pos = str.find( ' ', 8 );
									else if( str.find( '=', 8 ) < pos ) pos = str.find( '=', 8 );
									String identifier = str.substr( 8, pos - 8 );

									String def;
									if( str.size() > 9 + identifier.size() )
									{
										size_t pos = str.find( '\n' );
										if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
										def = str.substr( 9 + identifier.size(), pos - 9 - identifier.size() );
									}

									if( identifier == "memmodel" )
									{
										if( def.empty() )
										{
											generateNotification( NT::err_incompleteMemModelPragma, std::make_shared<String>( str ), lineCount, path );
										}
										else if( def == "fast" )
										{
											definitions["byte"] = "fast byte";
											definitions["int"] = "fast int";
										}
										else if( def == "norm" )
										{
											definitions["byte"] = "norm byte";
											definitions["int"] = "norm int";
										}
										else generateNotification( NT::err_unknownMemModelPragma, std::make_shared<String>( str ), lineCount, path );
									}
									else generateNotification( NT::err_unknownPragma, std::make_shared<String>( str ), lineCount, path );
								}
								else generateNotification( NT::err_incompletePragma, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str == "##" || str == "#\r" || str == "##\r" )
								generateNotification( NT::warn_emptyDirective, std::make_shared<String>( str ), lineCount, path );
							else generateNotification( NT::err_unknownDirective, std::make_shared<String>( str ), lineCount, path );
						}
					}
					else generateNotification( NT::warn_emptyDirective, std::make_shared<String>( str ), lineCount, path );
				}
				else
				{
					if( !ignoreifdef )
					{//Is not ignored
						//Remove obsolete carriage returns
						replace( str, String( "\r" ), String() );
						str += '\n';

						//Replace defined constructs
						for( auto &s : definitions )
						{//todo: should not be replaced in string literals!
							replace( str, s.first, s.second );
						}

						//Replace debuggable information
						replace( str, String( "__FILE__" ), path->generic_string() );
						replace( str, String( "__LINE__" ), to_string( lineCount ) );
						replace( str, String( "__TIME__" ), String( "" ) );//todo
						replace( str, String( "__DATE__" ), String( "" ) );//todo

						result.push_back( CodeBase::LineContent( std::make_shared<String>( str ), path, lineCount ) );
					}
				}
			}
		}
	}